

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

void lj_tab_free(global_State *g,GCtab *t)

{
  size_t *psVar1;
  uint32_t uVar2;
  size_t sVar3;
  
  if (t->hmask != 0) {
    uVar2 = (t->node).ptr32;
    sVar3 = (ulong)(t->hmask + 1) * 0x18;
    (g->gc).total = (g->gc).total - (int)sVar3;
    psVar1 = &(g->gc).freed;
    *psVar1 = *psVar1 + sVar3;
    (*g->allocf)(g->allocd,(void *)uVar2,sVar3,0);
  }
  if (((ulong)t->asize != 0) && (t->colo < '\x01')) {
    uVar2 = (t->array).ptr32;
    sVar3 = (ulong)t->asize * 8;
    (g->gc).total = (g->gc).total - (int)sVar3;
    psVar1 = &(g->gc).freed;
    *psVar1 = *psVar1 + sVar3;
    (*g->allocf)(g->allocd,(void *)uVar2,sVar3,0);
  }
  if (t->colo == 0) {
    (g->gc).total = (g->gc).total - 0x20;
    sVar3 = 0x20;
  }
  else {
    sVar3 = (ulong)((byte)t->colo & 0x7f) * 8 + 0x20;
    (g->gc).total = (g->gc).total - (int)sVar3;
  }
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + sVar3;
  (*g->allocf)(g->allocd,t,sVar3,0);
  psVar1 = &(g->gc).tabnum;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void LJ_FASTCALL lj_tab_free(global_State *g, GCtab *t)
{
  if (t->hmask > 0)
    lj_mem_freevec(g, noderef(t->node), t->hmask+1, Node);
  if (t->asize > 0 && LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
    lj_mem_freevec(g, tvref(t->array), t->asize, TValue);
  if (LJ_MAX_COLOSIZE != 0 && t->colo)
    lj_mem_free(g, t, sizetabcolo((uint32_t)t->colo & 0x7f));
  else
    lj_mem_freet(g, t);
  g->gc.tabnum--;
}